

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

Vec_Wrd_t * Abc_SuppGen(int m,int n)

{
  Vec_Wrd_t *p;
  word *pwVar1;
  uint uVar2;
  uint uVar3;
  ulong Entry;
  
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pwVar1 = (word *)malloc(8000);
  p->pArray = pwVar1;
  if (n != 0x1f) {
    uVar3 = 1 << ((byte)n & 0x1f);
    if ((int)uVar3 < 2) {
      uVar3 = 1;
    }
    Entry = 0;
    do {
      uVar2 = (int)Entry - ((uint)(Entry >> 1) & 0x15555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      if (((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18 == m) {
        Vec_WrdPush(p,Entry);
      }
      Entry = Entry + 1;
    } while (uVar3 != Entry);
  }
  return p;
}

Assistant:

Vec_Wrd_t * Abc_SuppGen( int m, int n )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i, Size = (1 << n);
    for ( i = 0; i < Size; i++ )
        if ( Abc_SuppCountOnes(i) == m )
            Vec_WrdPush( vRes, i );
    return vRes;
}